

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crash_test.cc
# Opt level: O1

int main(void)

{
  size_type *psVar1;
  _func_int ***ppp_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  bool bVar5;
  undefined8 uVar6;
  uint uVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  __pid_t _Var12;
  RetCode RVar13;
  undefined8 *puVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  _func_int **pp_Var18;
  Engine EVar19;
  int i;
  long lVar20;
  int i_1;
  uint uVar21;
  long lVar22;
  long *in_FS_OFFSET;
  string __str;
  string value;
  string engine_path;
  int res;
  string __str_1;
  _func_int ***local_c0;
  long lStack_b8;
  _func_int **local_b0 [2];
  _func_int ***local_a0;
  size_t sStack_98;
  _func_int **local_90;
  undefined8 uStack_88;
  ulong local_80;
  string local_78;
  int local_54;
  Engine *local_50;
  long local_48;
  Engine local_40 [2];
  
  paVar3 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"======================= crash test ============================",
             "");
  printf("\x1b[1;32;40m%s\x1b[0m\n",local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"./data/test-","");
  uVar16 = rdtsc();
  cVar9 = '\x01';
  if (9 < uVar16) {
    uVar17 = uVar16;
    cVar8 = '\x04';
    do {
      cVar9 = cVar8;
      if (uVar17 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_0010371e;
      }
      if (uVar17 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_0010371e;
      }
      if (uVar17 < 10000) goto LAB_0010371e;
      bVar5 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar8 = cVar9 + '\x04';
    } while (bVar5);
    cVar9 = cVar9 + '\x01';
  }
LAB_0010371e:
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct((ulong)&local_c0,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_c0,(uint)lStack_b8,uVar16);
  pp_Var18 = (_func_int **)0xf;
  if (local_a0 != &local_90) {
    pp_Var18 = local_90;
  }
  if (pp_Var18 < (_func_int **)(lStack_b8 + sStack_98)) {
    pp_Var18 = (_func_int **)0xf;
    if (local_c0 != local_b0) {
      pp_Var18 = local_b0[0];
    }
    if ((_func_int **)(lStack_b8 + sStack_98) <= pp_Var18) {
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
      goto LAB_001037a3;
    }
  }
  puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0);
LAB_001037a3:
  psVar1 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_78.field_2._M_allocated_capacity = *psVar1;
    local_78.field_2._8_8_ = puVar14[3];
    local_78._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar1;
    local_78._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_78._M_string_length = puVar14[1];
  *puVar14 = psVar1;
  puVar14[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  local_80 = 0;
  printf("open engine_path: %s\n",local_78._M_dataplus._M_p);
  lVar22 = *in_FS_OFFSET;
  do {
    lVar20 = 0;
    do {
      if (*(char *)((long)in_FS_OFFSET + -4) == '\0') {
        *(undefined1 *)((long)in_FS_OFFSET + -4) = 1;
        uVar6 = rdtsc();
        *(int *)(in_FS_OFFSET + -1) = (int)uVar6;
      }
      iVar10 = rand_r((uint *)(lVar22 + -8));
      k[lVar20] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
                  [(ulong)(long)iVar10 % 0x3e];
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0xd);
    k[0xd] = '\0';
    local_c0 = local_b0;
    sVar15 = strlen(k);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,k,k + sVar15);
    uVar21 = 1;
    if (9 < local_80) {
      uVar16 = local_80;
      uVar7 = 4;
      do {
        uVar21 = uVar7;
        uVar11 = (uint)uVar16;
        if (uVar11 < 100) {
          uVar21 = uVar21 - 2;
          goto LAB_0010392b;
        }
        if (uVar11 < 1000) {
          uVar21 = uVar21 - 1;
          goto LAB_0010392b;
        }
        if (uVar11 < 10000) goto LAB_0010392b;
        uVar16 = (uVar16 & 0xffffffff) / 10000;
        uVar7 = uVar21 + 4;
      } while (99999 < uVar11);
      uVar21 = uVar21 + 1;
    }
LAB_0010392b:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar21);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,uVar21,(uint)local_80);
    pp_Var18 = (_func_int **)0xf;
    if (local_c0 != local_b0) {
      pp_Var18 = local_b0[0];
    }
    if (pp_Var18 < (_func_int **)(local_48 + lStack_b8)) {
      EVar19._vptr_Engine = (_func_int **)0xf;
      if (local_50 != local_40) {
        EVar19._vptr_Engine = local_40[0]._vptr_Engine;
      }
      if (EVar19._vptr_Engine < (_func_int **)(local_48 + lStack_b8)) goto LAB_001039ac;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_c0);
    }
    else {
LAB_001039ac:
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_50);
    }
    uVar16 = local_80;
    ppp_Var2 = (_func_int ***)(puVar14 + 2);
    if ((_func_int ***)*puVar14 == ppp_Var2) {
      local_90 = *ppp_Var2;
      uStack_88 = puVar14[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *ppp_Var2;
      local_a0 = (_func_int ***)*puVar14;
    }
    sStack_98 = puVar14[1];
    *puVar14 = ppp_Var2;
    puVar14[1] = 0;
    *(undefined1 *)ppp_Var2 = 0;
    std::__cxx11::string::operator=((string *)(ks_abi_cxx11_ + local_80),(string *)&local_a0);
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (local_c0 != local_b0) {
      operator_delete(local_c0);
    }
    lVar20 = 0;
    do {
      if (*(char *)((long)in_FS_OFFSET + -4) == '\0') {
        *(undefined1 *)((long)in_FS_OFFSET + -4) = 1;
        uVar6 = rdtsc();
        *(int *)(in_FS_OFFSET + -1) = (int)uVar6;
      }
      iVar10 = rand_r((uint *)(lVar22 + -8));
      v[lVar20] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
                  [(ulong)(long)iVar10 % 0x3e];
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x2a5);
    v[0x2a5] = '\0';
    pcVar4 = (char *)vs_abi_cxx11_[uVar16]._M_string_length;
    strlen(v);
    std::__cxx11::string::_M_replace((ulong)(vs_abi_cxx11_ + uVar16),0,pcVar4,0x109580);
    local_80 = local_80 + 1;
  } while (local_80 != 30000);
  signal(10,handler);
  _Var12 = fork();
  if (_Var12 == 0) {
    local_50 = (Engine *)0x0;
    RVar13 = polar_race::Engine::Open(&local_78,&local_50);
    if (RVar13 != kSucc) {
      __assert_fail("ret == kSucc",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,0x32,"int main()");
    }
    lVar22 = 8;
    do {
      local_a0 = *(_func_int ****)(v + lVar22 + 0x2338);
      sStack_98 = *(size_t *)((long)&ks_abi_cxx11_[0]._M_dataplus._M_p + lVar22);
      local_c0 = *(_func_int ****)((long)&ks_abi_cxx11_[29999].field_2 + lVar22 + 8);
      lStack_b8 = *(undefined8 *)((long)&vs_abi_cxx11_[0]._M_dataplus._M_p + lVar22);
      iVar10 = (*local_50->_vptr_Engine[2])(local_50,&local_a0,&local_c0);
      if (iVar10 != 0) {
        __assert_fail("ret == kSucc",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                      ,0x35,"int main()");
      }
      if (lVar22 == 0x4e208) {
        _Var12 = getppid();
        kill(_Var12,10);
      }
      lVar22 = lVar22 + 0x20;
    } while (lVar22 != 0xea608);
    if (local_50 != (Engine *)0x0) {
      (*local_50->_vptr_Engine[1])();
    }
  }
  else {
    if (_Var12 < 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,99,"int main()");
    }
    do {
    } while (need_kill != true);
    local_54 = kill(_Var12,9);
    if (local_54 != 0) {
      __assert_fail("res == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,0x41,"int main()");
    }
    waitpid(_Var12,&local_54,0);
    if (local_54 < 1) {
      __assert_fail("res > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,0x44,"int main()");
    }
    local_50 = (Engine *)0x0;
    RVar13 = polar_race::Engine::Open(&local_78,&local_50);
    if (RVar13 != kSucc) {
      __assert_fail("ret == kSucc",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,0x49,"int main()");
    }
    sStack_98 = 0;
    local_90 = (_func_int **)((ulong)local_90 & 0xffffffffffffff00);
    lVar22 = 8;
    local_a0 = &local_90;
    do {
      local_c0 = *(_func_int ****)(v + lVar22 + 0x2338);
      lStack_b8 = *(undefined8 *)((long)&ks_abi_cxx11_[0]._M_dataplus._M_p + lVar22);
      iVar10 = (*local_50->_vptr_Engine[3])(local_50,&local_c0,&local_a0);
      if (iVar10 != 0) {
        __assert_fail("ret == kSucc",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                      ,0x4f,"int main()");
      }
      if ((sStack_98 != *(size_t *)((long)&vs_abi_cxx11_[0]._M_dataplus._M_p + lVar22)) ||
         ((sStack_98 != 0 &&
          (iVar10 = bcmp(local_a0,*(void **)((long)&ks_abi_cxx11_[29999].field_2 + lVar22 + 8),
                         sStack_98), iVar10 != 0)))) {
        __assert_fail("value == vs[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                      ,0x50,"int main()");
      }
      lVar22 = lVar22 + 0x20;
    } while (lVar22 != 0x4e228);
    uVar21 = 0x2711;
    lVar22 = 0x4e228;
    do {
      local_c0 = *(_func_int ****)(v + lVar22 + 0x2338);
      lStack_b8 = *(undefined8 *)((long)&ks_abi_cxx11_[0]._M_dataplus._M_p + lVar22);
      iVar10 = (*local_50->_vptr_Engine[3])(local_50,&local_c0,&local_a0);
      if (iVar10 != 0) {
        if (iVar10 != 1) {
          __assert_fail("ret == kNotFound",
                        "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                        ,0x57,"int main()");
        }
        goto LAB_00103d8b;
      }
      if ((sStack_98 != *(size_t *)((long)&vs_abi_cxx11_[0]._M_dataplus._M_p + lVar22)) ||
         ((sStack_98 != 0 &&
          (iVar10 = bcmp(local_a0,*(void **)((long)&ks_abi_cxx11_[29999].field_2 + lVar22 + 8),
                         sStack_98), iVar10 != 0)))) {
        __assert_fail("value == vs[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                      ,0x55,"int main()");
      }
      uVar21 = uVar21 + 1;
      lVar22 = lVar22 + 0x20;
    } while (lVar22 != 0xea608);
    uVar21 = 30000;
LAB_00103d8b:
    if (uVar21 < 30000) {
      lVar22 = (ulong)uVar21 << 5;
      do {
        local_c0 = *(_func_int ****)((long)&ks_abi_cxx11_[0]._M_dataplus._M_p + lVar22);
        lStack_b8 = *(undefined8 *)((long)&ks_abi_cxx11_[0]._M_string_length + lVar22);
        iVar10 = (*local_50->_vptr_Engine[3])(local_50,&local_c0,&local_a0);
        if (iVar10 != 1) {
          __assert_fail("ret == kNotFound",
                        "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                        ,0x5e,"int main()");
        }
        lVar22 = lVar22 + 0x20;
      } while (lVar22 != 960000);
    }
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,
               "======================= crash test pass :) ======================","");
    printf("\x1b[1;32;40m%s\x1b[0m\n",local_c0);
    if (local_c0 != local_b0) {
      operator_delete(local_c0);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main() {

    printf_( "======================= crash test ============================");
    std::string engine_path =
        std::string("./data/test-") + std::to_string(asm_rdtsc());
    printf("open engine_path: %s\n", engine_path.c_str());

    for (int i = 0; i < KV_CNT; ++i) {
        gen_random(k, 13);
        ks[i] = std::string(k) + std::to_string(i);
        gen_random(v, 677);
        vs[i] = v;
    }

    signal(SIGUSR1, handler);
    pid_t fpid = fork();
    if (fpid == 0) { // child
        Engine *engine = NULL;
        RetCode ret = Engine::Open(engine_path, &engine);
        assert(ret == kSucc);
        for (int i = 0; i < KV_CNT; ++i) {
            RetCode ret = engine->Write(ks[i], vs[i]);
            assert(ret == kSucc);
            if (i == KV_CNT / 3) {
                kill(getppid(), SIGUSR1);
            }
        }
        delete engine;

    } else if (fpid > 0) { // me

        while (!need_kill);

        int res = kill(fpid, 9);
        assert(res == 0);
        
        waitpid(fpid, &res, 0);
        assert(res > 0);

        // re-open and check 
        Engine *engine = NULL;
        RetCode ret = Engine::Open(engine_path, &engine);
        assert(ret == kSucc);
        std::string value;

        int i = 0;
        for (; i <= KV_CNT / 3; ++i) {
            ret = engine->Read(ks[i], &value);
            assert(ret == kSucc);
            assert(value == vs[i]);
        }
        for (; i < KV_CNT; ++i) {
            ret = engine->Read(ks[i], &value);
            if (ret == kSucc) {
                assert(value == vs[i]);
            } else {
                assert(ret == kNotFound);
                break;
            }

        }
        for (; i < KV_CNT; ++i) {
            ret = engine->Read(ks[i], &value);
            assert(ret == kNotFound);
        }
        printf_( "======================= crash test pass :) " "======================");

    } else {
        assert(false);
    }

    return 0;
}